

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int l)

{
  Lock local_30;
  
  local_30._mutex = &this->_toYa->super_Mutex;
  if ((ToYa *)local_30._mutex != (ToYa *)0x0) {
    std::mutex::lock(local_30._mutex);
    local_30._locked = true;
    ToYa::writeTile(this->_toYa,dx,dy,l,l);
    IlmThread_2_5::Lock::~Lock(&local_30);
    return;
  }
  TiledOutputFile::writeTile(this->_outputFile,dx,dy,l);
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int l)
{
    if (_toYa)
    {
	Lock lock (*_toYa);
	_toYa->writeTile (dx, dy, l, l);
    }
    else
    {
	 _outputFile->writeTile (dx, dy, l);
    }
}